

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void shift_im(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  TCGContext_conflict2 *tcg_ctx;
  int iVar1;
  uint uVar2;
  TCGv_i32 arg1;
  TCGv_i32 ret;
  uint uVar3;
  uint arg2;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = opsize_bytes(opsize);
  uVar2 = insn & 7;
  arg1 = gen_extend(s,tcg_ctx->cpu_dregs[uVar2],opsize,(insn & 8) >> 3 ^ 1);
  arg2 = 8;
  if ((insn & 0xe00) != 0) {
    arg2 = insn >> 9 & 7;
  }
  tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,arg1,arg2 - 1);
    if ((insn & 8) == 0) {
      tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
    else {
      tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
  }
  else {
    uVar3 = iVar1 * 8;
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,arg1,uVar3 - arg2);
    tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
      if (arg2 < uVar3) {
        ret = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_V,arg1,uVar3 - 1);
        tcg_gen_sari_i32_m68k(tcg_ctx,ret,arg1,(uVar3 - arg2) + -1);
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_V,QREG_CC_V,ret);
        tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      }
      else {
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_V,arg1,QREG_CC_V);
      }
      tcg_gen_neg_i32(tcg_ctx,QREG_CC_V,QREG_CC_V);
    }
  }
  gen_ext(tcg_ctx,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,1);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_X,QREG_CC_C);
  gen_partset_reg(tcg_ctx,opsize,tcg_ctx->cpu_dregs[uVar2],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void shift_im(DisasContext *s, uint16_t insn, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int count = (insn >> 9) & 7;
    int logical = insn & 8;
    int left = insn & 0x100;
    int bits = opsize_bytes(opsize) * 8;
    TCGv reg = gen_extend(s, DREG(insn, 0), opsize, !logical);

    if (count == 0) {
        count = 8;
    }

    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, bits - count);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, reg, count);

        /*
         * Note that ColdFire always clears V (done above),
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation.
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            /* if shift count >= bits, V is (reg != 0) */
            if (count >= bits) {
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, reg, QREG_CC_V);
            } else {
                TCGv t0 = tcg_temp_new(tcg_ctx);
                tcg_gen_sari_i32(tcg_ctx, QREG_CC_V, reg, bits - 1);
                tcg_gen_sari_i32(tcg_ctx, t0, reg, bits - count - 1);
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, t0);
                tcg_temp_free(tcg_ctx, t0);
            }
            tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        }
    } else {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, count - 1);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, reg, count);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, reg, count);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    gen_partset_reg(tcg_ctx, opsize, DREG(insn, 0), QREG_CC_N);
    set_cc_op(s, CC_OP_FLAGS);
}